

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

void __thiscall
cmComputeLinkDepends::AddLinkEntries<cmLinkItem>
          (cmComputeLinkDepends *this,int depender_index,
          vector<cmLinkItem,_std::allocator<cmLinkItem>_> *libs)

{
  _Rb_tree_color _Var1;
  size_t sVar2;
  cmake *pcVar3;
  pointer pLVar4;
  cmGeneratorTarget *this_00;
  pointer pLVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  cmake *pcVar7;
  cmLocalGenerator *__n;
  _Base_ptr p_Var8;
  pointer pcVar9;
  iterator iVar10;
  bool bVar11;
  _Alloc_hider _Var12;
  undefined8 uVar13;
  bool bVar14;
  int iVar15;
  TargetType TVar16;
  uint uVar17;
  string *psVar18;
  string *psVar19;
  pair<int,_bool> pVar20;
  const_iterator cVar21;
  long lVar22;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var23;
  _Rb_tree_node_base *p_Var24;
  ulong uVar25;
  pointer pLVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s1;
  cmGlobalGenerator *__s1_00;
  pointer this_01;
  _Rb_tree_color _Var27;
  _Base_ptr p_Var28;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  int dependee_index;
  pair<int,_bool> groupIndex;
  string feature;
  vector<int,_std::allocator<int>_> indexes;
  vector<int,_std::allocator<int>_> groupItems;
  int index;
  map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  dependSets;
  _Rb_tree_color local_280;
  _Rb_tree_color local_27c;
  char local_278;
  uint local_274;
  _Alloc_hider local_270;
  cmake *local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Base_ptr local_250;
  string local_248;
  undefined1 local_218 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  _Alloc_hider local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  cmake *local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  _Base_ptr local_1c8;
  _Base_ptr local_1c0;
  _Base_ptr local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b0;
  cmake *local_1a8;
  _Alloc_hider local_1a0;
  size_type local_198;
  char *local_190 [2];
  _Base_ptr local_180;
  _Rb_tree_node_base local_178;
  size_t local_158;
  char *local_150;
  undefined1 local_140 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  ulong local_118;
  _Rb_tree_node_base *local_110;
  vector<int,_std::allocator<int>_> local_108;
  cmake *local_e8;
  cmLinkItem *local_e0;
  string local_d8;
  undefined1 local_b8 [48];
  vector<int,std::allocator<int>> *local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  pointer local_68;
  undefined1 local_60 [40];
  size_t local_38;
  
  local_60._24_8_ = local_60 + 8;
  local_60._8_4_ = _S_red;
  local_60._16_8_ = (_Base_ptr)0x0;
  local_38 = 0;
  local_270._M_p = (pointer)&local_260;
  local_274 = depender_index;
  local_60._32_8_ = local_60._24_8_;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,
             LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p +
             LinkEntry::DEFAULT_abi_cxx11_._M_string_length);
  local_27c = ~_S_red;
  local_278 = '\0';
  local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  this_01 = (libs->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_68 = (libs->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  p_Var24 = (_Rb_tree_node_base *)local_60._24_8_;
  if (this_01 != local_68) {
    local_118 = (ulong)local_274;
    local_88 = (vector<int,std::allocator<int>> *)&this->OriginalEntries;
    local_78 = (_Base_ptr)&this->GroupItems;
    local_70 = (_Base_ptr)&this->LinkLibraryOverride;
    local_80 = &(this->LinkLibraryOverride)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_110 = &(this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header;
    bVar11 = false;
    do {
      psVar18 = cmLinkItem::AsStr_abi_cxx11_(this_01);
      psVar19 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      sVar2 = psVar18->_M_string_length;
      if (((sVar2 != psVar19->_M_string_length) ||
          ((sVar2 != 0 &&
           (iVar15 = bcmp((psVar18->_M_dataplus)._M_p,(psVar19->_M_dataplus)._M_p,sVar2),
           iVar15 != 0)))) &&
         (psVar18 = cmLinkItem::AsStr_abi_cxx11_(this_01), psVar18->_M_string_length != 0)) {
        psVar18 = cmLinkItem::AsStr_abi_cxx11_(this_01);
        local_218._8_8_ = (psVar18->_M_dataplus)._M_p;
        local_218._0_8_ = psVar18->_M_string_length;
        __str._M_str = (char *)DAT_00969b60;
        __str._M_len = (size_t)(anonymous_namespace)::LL_BEGIN;
        iVar15 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_218,0,
                            (size_type)(anonymous_namespace)::LL_BEGIN,__str);
        if (iVar15 == 0) {
          psVar18 = cmLinkItem::AsStr_abi_cxx11_(this_01);
          if ((psVar18->_M_string_length != 0) &&
             ((psVar18->_M_dataplus)._M_p[psVar18->_M_string_length - 1] == '>')) {
            psVar18 = cmLinkItem::AsStr_abi_cxx11_(this_01);
            std::__cxx11::string::find((char)psVar18,0x3e);
            std::__cxx11::string::substr((ulong)local_218,(ulong)psVar18);
            std::__cxx11::string::operator=((string *)&local_270,(string *)local_218);
            if ((cmake *)local_218._0_8_ != (cmake *)(local_218 + 0x10)) {
              operator_delete((void *)local_218._0_8_,
                              (ulong)((long)&(((RegisteredGeneratorsVector *)local_218._16_8_)->
                                             super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 1));
            }
            uVar25 = local_118;
            if (-1 < (int)local_274) {
              pLVar26 = (this->EntryList).
                        super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              this_00 = pLVar26[local_118].Target;
              if (((this_00 != (cmGeneratorTarget *)0x0) &&
                  (bVar14 = cmGeneratorTarget::IsImported(this_00), bVar14)) &&
                 (bVar14 = anon_unknown.dwarf_23f0498::IsFeatureSupported
                                     ((anon_unknown_dwarf_23f0498 *)this->Makefile,
                                      (cmMakefile *)(this->LinkLanguage)._M_dataplus._M_p,
                                      (string *)(this->LinkLanguage)._M_string_length,
                                      (string *)&local_270), !bVar14)) {
                pcVar3 = this->CMakeInstance;
                psVar18 = cmGeneratorTarget::GetName_abi_cxx11_(pLVar26[uVar25].Target);
                local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(psVar18->_M_dataplus)._M_p;
                local_218._16_8_ = psVar18->_M_string_length;
                local_218._0_8_ = (cmake *)0x17;
                local_218._8_8_ = "The \'IMPORTED\' target \'";
                local_1f8._M_p = &DAT_00000044;
                local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x7995fa;
                local_1e8._M_allocated_capacity = (size_type)local_268;
                local_1e8._8_8_ = local_270._M_p;
                local_1d8 = (cmake *)0x5c;
                local_1d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x79963f;
                local_1c0 = (_Base_ptr)(this->LinkLanguage)._M_dataplus._M_p;
                local_1c8 = (_Base_ptr)(this->LinkLanguage)._M_string_length;
                local_1b8 = (_Base_ptr)&DAT_00000014;
                local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x785c1a;
                local_1a8 = local_268;
                local_1a0._M_p = local_270._M_p;
                local_198 = 0xd;
                local_190[0] = "\" and \"CMAKE_";
                local_178._M_color = 0x14;
                local_178._4_4_ = 0;
                local_178._M_parent = (_Base_ptr)0x785c1a;
                local_178._M_left = (_Base_ptr)local_268;
                local_178._M_right = (_Base_ptr)local_270._M_p;
                local_158 = 0xc;
                local_150 = "_SUPPORTED\"?";
                views_06._M_len = 0xd;
                views_06._M_array = (iterator)local_218;
                local_190[1] = (char *)local_1c8;
                local_180 = local_1c0;
                cmCatViews_abi_cxx11_(&local_248,views_06);
                cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_218);
                cmake::IssueMessage(pcVar3,AUTHOR_ERROR,&local_248,(cmListFileBacktrace *)local_218)
                ;
                if ((cmake *)local_218._8_8_ != (cmake *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_248._M_dataplus._M_p != &local_248.field_2) {
                  operator_delete(local_248._M_dataplus._M_p,
                                  CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                           local_248.field_2._M_local_buf[0]) + 1);
                }
              }
            }
            goto LAB_0054dad7;
          }
        }
        psVar18 = cmLinkItem::AsStr_abi_cxx11_(this_01);
        local_218._8_8_ = (psVar18->_M_dataplus)._M_p;
        local_218._0_8_ = psVar18->_M_string_length;
        __str_00._M_str = DAT_00969b70;
        __str_00._M_len = (anonymous_namespace)::LL_END;
        iVar15 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_218,0,
                            (anonymous_namespace)::LL_END,__str_00);
        if (iVar15 == 0) {
          psVar18 = cmLinkItem::AsStr_abi_cxx11_(this_01);
          if ((psVar18->_M_string_length != 0) &&
             ((psVar18->_M_dataplus)._M_p[psVar18->_M_string_length - 1] == '>')) {
            std::__cxx11::string::_M_assign((string *)&local_270);
            goto LAB_0054dad7;
          }
        }
        psVar18 = cmLinkItem::AsStr_abi_cxx11_(this_01);
        local_218._8_8_ = (psVar18->_M_dataplus)._M_p;
        local_218._0_8_ = psVar18->_M_string_length;
        __str_01._M_str = (char *)DAT_00969b80;
        __str_01._M_len = (size_t)(anonymous_namespace)::LG_BEGIN;
        iVar15 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_218,0,
                            (size_type)(anonymous_namespace)::LG_BEGIN,__str_01);
        local_e0 = this_01;
        if (iVar15 == 0) {
          psVar18 = cmLinkItem::AsStr_abi_cxx11_(this_01);
          if ((psVar18->_M_string_length != 0) &&
             ((psVar18->_M_dataplus)._M_p[psVar18->_M_string_length - 1] == '>')) {
            pVar20 = AddLinkEntry(this,this_01,-1);
            _Var27 = pVar20.first;
            local_278 = pVar20.second;
            local_27c = _Var27;
            if (((ulong)pVar20 >> 0x20 & 1) != 0) {
              pLVar26 = (this->EntryList).
                        super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              psVar18 = cmLinkItem::AsStr_abi_cxx11_(this_01);
              std::__cxx11::string::find((char)psVar18,0x3a);
              std::__cxx11::string::substr((ulong)local_218,(ulong)psVar18);
              std::__cxx11::string::operator=
                        ((string *)&pLVar26[(int)_Var27].Feature,(string *)local_218);
              this_01 = local_e0;
              if ((cmake *)local_218._0_8_ != (cmake *)(local_218 + 0x10)) {
                operator_delete((void *)local_218._0_8_,
                                (ulong)((long)&(((RegisteredGeneratorsVector *)local_218._16_8_)->
                                               super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start + 1));
              }
            }
            if ((int)local_274 < 0) {
              iVar10._M_current =
                   (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar10._M_current ==
                  (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                bVar11 = true;
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_88,iVar10,(int *)&local_27c);
                goto LAB_0054dad7;
              }
              *iVar10._M_current = local_27c;
              (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar10._M_current + 1;
            }
            else {
              pcVar9 = (this->EntryConstraintGraph).
                       super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                       super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl
                       .super__Vector_impl_data._M_start;
              local_248._M_dataplus._M_p = local_248._M_dataplus._M_p & 0xffffffffffffff00;
              local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
              local_218._0_8_ = (cmake *)0x0;
              local_218._8_8_ = (cmake *)0x0;
              cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                        ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_218);
              std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
              emplace_back<int&,bool,bool,cmListFileBacktrace>
                        ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)(pcVar9 + local_118),
                         (int *)&local_27c,(bool *)&local_248,(bool *)local_b8,
                         (cmListFileBacktrace *)local_218);
              if ((cmake *)local_218._8_8_ != (cmake *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
              }
            }
            bVar11 = true;
            goto LAB_0054dad7;
          }
        }
        psVar18 = cmLinkItem::AsStr_abi_cxx11_(this_01);
        local_218._8_8_ = (psVar18->_M_dataplus)._M_p;
        local_218._0_8_ = psVar18->_M_string_length;
        __str_02._M_str = DAT_00969b90;
        __str_02._M_len = (anonymous_namespace)::LG_END;
        iVar15 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_218,0,
                            (anonymous_namespace)::LG_END,__str_02);
        if (iVar15 == 0) {
          psVar18 = cmLinkItem::AsStr_abi_cxx11_(this_01);
          if ((psVar18->_M_string_length != 0) &&
             ((psVar18->_M_dataplus)._M_p[psVar18->_M_string_length - 1] == '>')) {
            local_280 = local_27c;
            if (local_278 == '\x01') {
              std::
              _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              ::_M_emplace_unique<int&,std::vector<int,std::allocator<int>>&>
                        ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                          *)local_78,(int *)&local_27c,&local_108);
            }
            local_27c = ~_S_red;
            local_278 = '\0';
            if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            bVar11 = false;
            goto LAB_0054dad7;
          }
        }
        uVar25 = local_118;
        _Var27 = local_27c;
        if ((-1 < (int)local_274) && (bVar11)) {
          pLVar26 = (this->EntryList).
                    super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pLVar26[local_118].Target != (cmGeneratorTarget *)0x0) &&
             (bVar14 = cmGeneratorTarget::IsImported(pLVar26[local_118].Target), bVar14)) {
            psVar18 = &pLVar26[(int)_Var27].Feature;
            bVar14 = anon_unknown.dwarf_23f0498::IsGroupFeatureSupported
                               ((anon_unknown_dwarf_23f0498 *)this->Makefile,
                                (cmMakefile *)(this->LinkLanguage)._M_dataplus._M_p,
                                (string *)(this->LinkLanguage)._M_string_length,psVar18);
            if (!bVar14) {
              pcVar3 = this->CMakeInstance;
              psVar19 = cmGeneratorTarget::GetName_abi_cxx11_(pLVar26[uVar25].Target);
              local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(psVar19->_M_dataplus)._M_p;
              local_218._16_8_ = psVar19->_M_string_length;
              local_218._0_8_ = (cmake *)0x17;
              local_218._8_8_ = "The \'IMPORTED\' target \'";
              local_1f8._M_p = &DAT_00000042;
              local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x7996b7;
              local_1e8._8_8_ = (psVar18->_M_dataplus)._M_p;
              local_1e8._M_allocated_capacity = pLVar26[(int)_Var27].Feature._M_string_length;
              local_1d8 = (cmake *)0x5c;
              local_1d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x79963f;
              local_1c0 = (_Base_ptr)(this->LinkLanguage)._M_dataplus._M_p;
              local_1c8 = (_Base_ptr)(this->LinkLanguage)._M_string_length;
              local_1b8 = (_Base_ptr)0x12;
              local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x785ee3;
              local_1a0._M_p = (psVar18->_M_dataplus)._M_p;
              local_1a8 = (cmake *)pLVar26[(int)_Var27].Feature._M_string_length;
              local_198 = 0xd;
              local_190[0] = "\" and \"CMAKE_";
              local_178._M_color = 0x12;
              local_178._4_4_ = 0;
              local_178._M_parent = (_Base_ptr)0x785ee3;
              local_178._M_right = (_Base_ptr)(psVar18->_M_dataplus)._M_p;
              local_178._M_left = (_Base_ptr)pLVar26[(int)_Var27].Feature._M_string_length;
              local_158 = 0xc;
              local_150 = "_SUPPORTED\"?";
              views._M_len = 0xd;
              views._M_array = (iterator)local_218;
              local_190[1] = (char *)local_1c8;
              local_180 = local_1c0;
              cmCatViews_abi_cxx11_(&local_248,views);
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_218);
              cmake::IssueMessage(pcVar3,AUTHOR_ERROR,&local_248,(cmListFileBacktrace *)local_218);
              if ((cmake *)local_218._8_8_ != (cmake *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                         local_248.field_2._M_local_buf[0]) + 1);
              }
            }
          }
        }
        pVar20 = AddLinkEntry(this,this_01,local_27c);
        local_280 = pVar20.first;
        pLVar26 = (this->EntryList).
                  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start + (int)local_280;
        cVar21 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_70,(key_type *)pLVar26);
        local_250 = cVar21._M_node + 2;
        if (cVar21._M_node == local_80) {
          local_250 = (_Base_ptr)&local_270;
        }
        if (((((ulong)pVar20 >> 0x20 & 1) != 0 && !(bool)~bVar11) &&
            (pLVar26->Target != (cmGeneratorTarget *)0x0)) &&
           ((TVar16 = cmGeneratorTarget::GetType(pLVar26->Target), TVar16 == OBJECT_LIBRARY ||
            (TVar16 = cmGeneratorTarget::GetType(pLVar26->Target), TVar16 == INTERFACE_LIBRARY)))) {
          lVar22 = (long)(int)local_27c;
          local_e8 = this->CMakeInstance;
          pLVar4 = (this->EntryList).
                   super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pLVar4[lVar22].Feature._M_dataplus._M_p;
          pcVar3 = (cmake *)pLVar4[lVar22].Feature._M_string_length;
          TVar16 = cmGeneratorTarget::GetType(pLVar26->Target);
          local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x78951a;
          if (TVar16 == OBJECT_LIBRARY) {
            local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x781e5b;
          }
          local_218._0_8_ = (cmake *)0xd;
          local_218._8_8_ = "The feature \'";
          local_200 = local_120;
          local_1f8._M_p = (pointer)0x31;
          local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x799708;
          local_1e8._M_allocated_capacity = (size_type)(anonymous_namespace)::LG_BEGIN;
          local_1e8._8_8_ = DAT_00969b80;
          local_1d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pLVar4[lVar22].Feature._M_dataplus._M_p;
          local_1d8 = (cmake *)pLVar4[lVar22].Feature._M_string_length;
          local_1c8 = (_Base_ptr)0x1f;
          local_1c0 = (_Base_ptr)0x79973a;
          local_1b8 = (_Base_ptr)((ulong)(TVar16 != OBJECT_LIBRARY) * 3 + 6);
          local_1a8 = (cmake *)0xa;
          local_1a0._M_p = " library \'";
          local_190[0] = (pLVar26->Item).Value._M_dataplus._M_p;
          local_198 = (pLVar26->Item).Value._M_string_length;
          local_190[1] = (char *)0x2;
          local_180 = (_Base_ptr)0x7651e7;
          views_00._M_len = 10;
          views_00._M_array = (iterator)local_218;
          local_218._16_8_ = pcVar3;
          cmCatViews_abi_cxx11_(&local_248,views_00);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_218);
          cmake::IssueMessage(local_e8,AUTHOR_WARNING,&local_248,(cmListFileBacktrace *)local_218);
          this_01 = local_e0;
          if ((cmake *)local_218._8_8_ != (cmake *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,
                            CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                     local_248.field_2._M_local_buf[0]) + 1);
          }
        }
        local_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&cVar21._M_node[2]._M_parent;
        if (cVar21._M_node == local_80) {
          local_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&local_268;
        }
        p_Var28 = (_Base_ptr)local_120->_M_allocated_capacity;
        if (p_Var28 == (_Base_ptr)LinkEntry::DEFAULT_abi_cxx11_._M_string_length) {
          if ((p_Var28 != (_Base_ptr)0x0) &&
             (iVar15 = bcmp(*(void **)local_250,LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,
                            (size_t)p_Var28), iVar15 != 0 && ((ulong)pVar20 >> 0x20 & 1) != 0)) {
LAB_0054cd25:
            if ((pLVar26->Target == (cmGeneratorTarget *)0x0) ||
               ((TVar16 = cmGeneratorTarget::GetType(pLVar26->Target), TVar16 != OBJECT_LIBRARY &&
                (TVar16 = cmGeneratorTarget::GetType(pLVar26->Target), TVar16 != INTERFACE_LIBRARY))
               )) {
              std::__cxx11::string::_M_assign((string *)&pLVar26->Feature);
            }
            else {
              pcVar7 = local_268;
              _Var12._M_p = local_270._M_p;
              pcVar3 = this->CMakeInstance;
              TVar16 = cmGeneratorTarget::GetType(pLVar26->Target);
              local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x78951a;
              if (TVar16 == OBJECT_LIBRARY) {
                local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x781e5b;
              }
              local_218._0_8_ = (cmake *)0xd;
              local_218._8_8_ = "The feature \'";
              local_218._16_8_ = pcVar7;
              local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_Var12._M_p;
              local_1f8._M_p = (pointer)0x31;
              local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x799708;
              local_1e8._M_allocated_capacity = (size_type)(anonymous_namespace)::LL_BEGIN;
              local_1e8._8_8_ = DAT_00969b60;
              local_1d8 = local_268;
              local_1d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_270._M_p;
              local_1c8 = (_Base_ptr)0x1f;
              local_1c0 = (_Base_ptr)0x79973a;
              local_1b8 = (_Base_ptr)((ulong)(TVar16 != OBJECT_LIBRARY) * 3 + 6);
              local_1a8 = (cmake *)0xa;
              local_1a0._M_p = " library \'";
              local_190[0] = (pLVar26->Item).Value._M_dataplus._M_p;
              local_198 = (pLVar26->Item).Value._M_string_length;
              local_190[1] = (char *)0x2;
              local_180 = (_Base_ptr)0x7651e7;
              views_01._M_len = 10;
              views_01._M_array = (iterator)local_218;
              cmCatViews_abi_cxx11_(&local_248,views_01);
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_218);
              cmake::IssueMessage(pcVar3,AUTHOR_WARNING,&local_248,(cmListFileBacktrace *)local_218)
              ;
              if ((cmake *)local_218._8_8_ != (cmake *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                         local_248.field_2._M_local_buf[0]) + 1);
              }
            }
          }
        }
        else if (((ulong)pVar20 >> 0x20 & 1) != 0) goto LAB_0054cd25;
        if ((pLVar26->Target == (cmGeneratorTarget *)0x0) ||
           ((TVar16 = cmGeneratorTarget::GetType(pLVar26->Target), TVar16 != OBJECT_LIBRARY &&
            (TVar16 = cmGeneratorTarget::GetType(pLVar26->Target), TVar16 != INTERFACE_LIBRARY)))) {
          _Var27 = local_27c;
          if ((bVar11) &&
             (p_Var24 = (this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             p_Var24 != local_110)) {
            pLVar4 = (this->EntryList).
                     super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar22 = (long)(int)local_27c;
            do {
              _Var1 = p_Var24[1]._M_color;
              pLVar5 = (this->EntryList).
                       super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              sVar2 = pLVar5[(int)_Var1].Feature._M_string_length;
              if (((sVar2 != pLVar4[(int)_Var27].Feature._M_string_length) ||
                  ((sVar2 != 0 &&
                   (iVar15 = bcmp(pLVar5[(int)_Var1].Feature._M_dataplus._M_p,
                                  pLVar4[lVar22].Feature._M_dataplus._M_p,sVar2), iVar15 != 0)))) &&
                 (_Var23 = std::
                           __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                     (p_Var24[1]._M_parent,p_Var24[1]._M_left,&local_280),
                 (_Base_ptr)_Var23._M_current != p_Var24[1]._M_left)) {
                pcVar3 = this->CMakeInstance;
                psVar18 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
                local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(psVar18->_M_dataplus)._M_p;
                local_218._16_8_ = psVar18->_M_string_length;
                local_218._0_8_ = (cmake *)0x1b;
                local_218._8_8_ = "Impossible to link target \'";
                local_1f8._M_p = (pointer)0x19;
                local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x799781;
                local_1e8._8_8_ = (pLVar26->Item).Value._M_dataplus._M_p;
                local_1e8._M_allocated_capacity = (pLVar26->Item).Value._M_string_length;
                local_1d8 = (cmake *)0x25;
                local_1d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x79979b;
                local_1c0 = (_Base_ptr)pLVar4[lVar22].Feature._M_dataplus._M_p;
                local_1c8 = (_Base_ptr)pLVar4[(int)_Var27].Feature._M_string_length;
                local_248._M_dataplus._M_p = (pointer)0x1;
                local_248._M_string_length = (size_type)&local_248.field_2;
                local_248.field_2._M_local_buf[0] = '\'';
                local_1b8 = (_Base_ptr)0x1;
                local_1a8 = (cmake *)0x29;
                local_1a0._M_p = ", has already occurred with the feature \'";
                local_190[0] = pLVar5[(int)_Var1].Feature._M_dataplus._M_p;
                local_198 = pLVar5[(int)_Var1].Feature._M_string_length;
                local_b8._0_8_ = (pointer)0x1;
                local_180 = (_Base_ptr)(local_b8 + 0x10);
                local_b8[0x10] = '\'';
                local_190[1] = (char *)0x1;
                local_178._M_color = 0x17;
                local_178._4_4_ = 0;
                local_178._M_parent = (_Base_ptr)0x7997eb;
                views_02._M_len = 0xb;
                views_02._M_array = (iterator)local_218;
                local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_248._M_string_length;
                local_b8._8_8_ = local_180;
                cmCatViews_abi_cxx11_((string *)local_140,views_02);
                cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_218);
                cmake::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_140,
                                    (cmListFileBacktrace *)local_218);
                if ((cmake *)local_218._8_8_ != (cmake *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
                }
                if ((_Base_ptr)local_140._0_8_ != (_Base_ptr)(local_140 + 0x10)) {
                  operator_delete((void *)local_140._0_8_,(ulong)(local_140._16_8_ + 1));
                }
              }
              p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24);
            } while (p_Var24 != local_110);
          }
          p_Var28 = (_Base_ptr)(pLVar26->Feature)._M_string_length;
          if ((p_Var28 != *(_Base_ptr *)local_120) ||
             ((p_Var28 != (_Base_ptr)0x0 &&
              (iVar15 = bcmp((pLVar26->Feature)._M_dataplus._M_p,*(void **)local_250,(size_t)p_Var28
                            ), iVar15 != 0)))) {
            pcVar3 = this->CMakeInstance;
            psVar18 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
            paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(psVar18->_M_dataplus)._M_p;
            local_e8 = (cmake *)psVar18->_M_string_length;
            pcVar7 = *(cmake **)local_120;
            if (pcVar7 == (cmake *)LinkEntry::DEFAULT_abi_cxx11_._M_string_length) {
              if (pcVar7 != (cmake *)0x0) {
                __s1 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         **)local_250;
                iVar15 = bcmp(__s1,LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,(size_t)pcVar7);
                if (iVar15 != 0) goto LAB_0054d471;
              }
              local_140._0_8_ = local_140 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_140,"without any feature or \'DEFAULT\' feature","");
            }
            else {
              __s1 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       **)local_250;
LAB_0054d471:
              local_218._0_8_ = (cmake *)0x12;
              local_218._8_8_ = "with the feature \'";
              local_248._M_dataplus._M_p = (pointer)0x1;
              local_248._M_string_length = (size_type)&local_248.field_2;
              local_248.field_2._M_local_buf[0] = '\'';
              local_1f8._M_p = (pointer)0x1;
              views_03._M_len = 3;
              views_03._M_array = (iterator)local_218;
              local_218._16_8_ = pcVar7;
              local_200 = __s1;
              local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_248._M_string_length;
              cmCatViews_abi_cxx11_((string *)local_140,views_03);
            }
            __n = (cmLocalGenerator *)(pLVar26->Feature)._M_string_length;
            if (__n == (cmLocalGenerator *)LinkEntry::DEFAULT_abi_cxx11_._M_string_length) {
              if (__n != (cmLocalGenerator *)0x0) {
                __s1_00 = (cmGlobalGenerator *)(pLVar26->Feature)._M_dataplus._M_p;
                iVar15 = bcmp(__s1_00,LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,(size_t)__n);
                if (iVar15 != 0) goto LAB_0054d54b;
              }
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d8,"without any feature or \'DEFAULT\' feature","");
            }
            else {
              __s1_00 = (cmGlobalGenerator *)(pLVar26->Feature)._M_dataplus._M_p;
LAB_0054d54b:
              local_218._0_8_ = (element_type *)0x12;
              local_218._8_8_ = "with the feature \'";
              local_248._M_dataplus._M_p = (pointer)0x1;
              local_248._M_string_length = (size_type)&local_248.field_2;
              local_248.field_2._M_local_buf[0] = '\'';
              local_1f8._M_p = (pointer)0x1;
              views_04._M_len = 3;
              views_04._M_array = (iterator)local_218;
              local_218._16_8_ = __n;
              local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)__s1_00;
              local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_248._M_string_length;
              cmCatViews_abi_cxx11_(&local_d8,views_04);
            }
            local_218._0_8_ = (cmake *)0x1b;
            local_218._8_8_ = "Impossible to link target \'";
            local_218._16_8_ = local_e8;
            local_1f8._M_p = (pointer)0x19;
            local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x799781;
            local_1e8._8_8_ = (pLVar26->Item).Value._M_dataplus._M_p;
            local_1e8._M_allocated_capacity = (pLVar26->Item).Value._M_string_length;
            local_1d8 = (cmake *)0xd;
            local_1d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x799803;
            local_1c8 = (_Base_ptr)local_140._8_8_;
            local_1c0 = (_Base_ptr)local_140._0_8_;
            local_1b8 = (_Base_ptr)0x17;
            local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x79983a;
            local_1a8 = (cmake *)local_d8._M_string_length;
            local_1a0._M_p = local_d8._M_dataplus._M_p;
            local_198 = 0x17;
            local_190[0] = ", which is not allowed.";
            views_05._M_len = 9;
            views_05._M_array = (iterator)local_218;
            local_200 = paVar6;
            cmCatViews_abi_cxx11_((string *)local_b8,views_05);
            cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_218);
            cmake::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_b8,
                                (cmListFileBacktrace *)local_218);
            if ((cmake *)local_218._8_8_ != (cmake *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
            }
            if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
              operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            if ((_Base_ptr)local_140._0_8_ != (_Base_ptr)(local_140 + 0x10)) {
              operator_delete((void *)local_140._0_8_,(ulong)(local_140._16_8_ + 1));
            }
          }
        }
        if (bVar11) {
          if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_108,
                       (iterator)
                       local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_280);
          }
          else {
            *local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = local_280;
            local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_218._0_8_ = (cmake *)0x0;
          local_218._8_8_ = (cmake *)0x0;
          local_218._16_8_ = (cmake *)0x0;
          p_Var24 = (this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if (p_Var24 == local_110) {
LAB_0054d8fd:
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)local_218,(iterator)local_218._8_8_,
                       (int *)&local_280);
            pcVar3 = (cmake *)local_218._0_8_;
            pcVar7 = (cmake *)local_218._8_8_;
          }
          else {
            local_250 = (_Base_ptr)((ulong)local_250 & 0xffffffff00000000);
            do {
              p_Var28 = p_Var24[1]._M_parent;
              p_Var8 = p_Var24[1]._M_left;
              if (p_Var28 != p_Var8) {
                pLVar4 = (this->EntryList).
                         super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                sVar2 = (pLVar26->Item).Value._M_string_length;
                do {
                  lVar22 = (long)(int)p_Var28->_M_color;
                  uVar25 = lVar22 * 0x60;
                  if (sVar2 == pLVar4[lVar22].Item.Value._M_string_length) {
                    if (sVar2 != 0) {
                      uVar17 = bcmp((pLVar26->Item).Value._M_dataplus._M_p,
                                    pLVar4[lVar22].Item.Value._M_dataplus._M_p,sVar2);
                      uVar25 = (ulong)uVar17;
                      if (uVar17 != 0) goto LAB_0054d835;
                    }
                    if (local_218._8_8_ == local_218._16_8_) {
                      local_250 = (_Base_ptr)
                                  CONCAT44(local_250._4_4_,(int)CONCAT71((int7)(uVar25 >> 8),1));
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)local_218,
                                 (iterator)local_218._8_8_,(int *)(p_Var24 + 1));
                    }
                    else {
                      _Var27 = p_Var24[1]._M_color;
                      *(_Rb_tree_color *)local_218._8_8_ = _Var27;
                      local_218._8_8_ = local_218._8_8_ + 4;
                      local_250 = (_Base_ptr)
                                  CONCAT44(local_250._4_4_,
                                           (int)CONCAT71((uint7)(uint3)(_Var27 >> 8),1));
                    }
                    break;
                  }
LAB_0054d835:
                  p_Var28 = (_Base_ptr)&p_Var28->field_0x4;
                } while (p_Var28 != p_Var8);
              }
              p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24);
            } while (p_Var24 != local_110);
            pcVar3 = (cmake *)local_218._0_8_;
            pcVar7 = (cmake *)local_218._8_8_;
            if (((ulong)local_250 & 1) == 0) {
              if (local_218._8_8_ == local_218._16_8_) goto LAB_0054d8fd;
              *(_Rb_tree_color *)
               &(((RegisteredGeneratorsVector *)local_218._8_8_)->
                super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start = local_280;
              local_218._8_8_ =
                   (long)&(((RegisteredGeneratorsVector *)local_218._8_8_)->
                          super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 4;
              pcVar7 = (cmake *)local_218._8_8_;
            }
          }
          for (; uVar13 = local_218._8_8_, pcVar3 != (cmake *)local_218._8_8_;
              pcVar3 = (cmake *)((long)&(pcVar3->Generators).
                                        super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 4)) {
            _Var27 = *(_Rb_tree_color *)
                      &(pcVar3->Generators).
                       super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            local_b8._4_4_ = (undefined4)((ulong)local_b8._0_8_ >> 0x20);
            local_b8._0_4_ = _Var27;
            if ((int)local_274 < 0) {
              iVar10._M_current =
                   (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar10._M_current ==
                  (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                local_218._8_8_ = pcVar7;
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_88,iVar10,(int *)local_b8);
                p_Var24 = (_Rb_tree_node_base *)local_60._24_8_;
              }
              else {
                *iVar10._M_current = _Var27;
                (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar10._M_current + 1;
                p_Var24 = (_Rb_tree_node_base *)local_60._24_8_;
                local_218._8_8_ = pcVar7;
              }
            }
            else {
              pcVar9 = (this->EntryConstraintGraph).
                       super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                       super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl
                       .super__Vector_impl_data._M_start;
              local_140._0_8_ = local_140._0_8_ & 0xffffffffffffff00;
              local_d8._M_dataplus._M_p = local_d8._M_dataplus._M_p & 0xffffffffffffff00;
              local_248._M_dataplus._M_p = (pointer)0x0;
              local_248._M_string_length = 0;
              local_218._8_8_ = pcVar7;
              cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                        ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_248);
              std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
              emplace_back<int&,bool,bool,cmListFileBacktrace>
                        ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)(pcVar9 + local_118),
                         (int *)local_b8,(bool *)local_140,(bool *)&local_d8,
                         (cmListFileBacktrace *)&local_248);
              p_Var24 = (_Rb_tree_node_base *)local_60._24_8_;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_248._M_string_length);
                p_Var24 = (_Rb_tree_node_base *)local_60._24_8_;
              }
            }
            for (; p_Var24 != (_Rb_tree_node_base *)(local_60 + 8);
                p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24)) {
              pLVar26 = (this->EntryList).
                        super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (((pLVar26[(int)local_b8._0_4_].Target == (cmGeneratorTarget *)0x0) &&
                  (1 < pLVar26[(int)local_b8._0_4_].Kind - Flag)) &&
                 (local_280 != p_Var24[1]._M_color)) {
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>
                          ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)&p_Var24[1]._M_parent,(int *)local_b8);
              }
            }
            if ((this->InferredDependSets).
                super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
                ._M_impl.super__Vector_impl_data._M_start[(int)local_b8._0_4_].Initialized != false)
            {
              std::
              map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
              ::operator[]((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                            *)local_60,(key_type *)local_b8);
            }
            pcVar7 = (cmake *)local_218._8_8_;
            local_218._8_8_ = uVar13;
          }
          this_01 = local_e0;
          local_218._8_8_ = pcVar7;
          if ((cmake *)local_218._0_8_ != (cmake *)0x0) {
            operator_delete((void *)local_218._0_8_,local_218._16_8_ - local_218._0_8_);
            this_01 = local_e0;
          }
        }
      }
LAB_0054dad7:
      this_01 = this_01 + 1;
      p_Var24 = (_Rb_tree_node_base *)local_60._24_8_;
    } while (this_01 != local_68);
  }
  for (; p_Var24 != (_Rb_tree_node_base *)(local_60 + 8);
      p_Var24 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var24)) {
    std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>::
    push_back(&(this->InferredDependSets).
               super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)p_Var24[1]._M_color].
               super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
              ,(value_type *)&p_Var24[1]._M_parent);
  }
  if ((_Base_ptr)
      local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (_Base_ptr)0x0) {
    operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_p != &local_260) {
    operator_delete(local_270._M_p,local_260._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_cmComputeLinkDepends::DependSet>,_std::_Select1st<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_cmComputeLinkDepends::DependSet>,_std::_Select1st<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
               *)local_60);
  return;
}

Assistant:

void cmComputeLinkDepends::AddLinkEntries(int depender_index,
                                          std::vector<T> const& libs)
{
  // Track inferred dependency sets implied by this list.
  std::map<int, DependSet> dependSets;
  std::string feature = LinkEntry::DEFAULT;

  bool inGroup = false;
  std::pair<int, bool> groupIndex{ -1, false };
  std::vector<int> groupItems;

  // Loop over the libraries linked directly by the depender.
  for (T const& l : libs) {
    // Skip entries that will resolve to the target getting linked or
    // are empty.
    cmLinkItem const& item = l;
    if (item.AsStr() == this->Target->GetName() || item.AsStr().empty()) {
      continue;
    }

    if (cmHasPrefix(item.AsStr(), LL_BEGIN) &&
        cmHasSuffix(item.AsStr(), '>')) {
      feature = ExtractFeature(item.AsStr());
      // emit a warning if an undefined feature is used as part of
      // an imported target
      if (depender_index >= 0) {
        const auto& depender = this->EntryList[depender_index];
        if (depender.Target != nullptr && depender.Target->IsImported() &&
            !IsFeatureSupported(this->Makefile, this->LinkLanguage, feature)) {
          this->CMakeInstance->IssueMessage(
            MessageType::AUTHOR_ERROR,
            cmStrCat("The 'IMPORTED' target '", depender.Target->GetName(),
                     "' uses the generator-expression '$<LINK_LIBRARY>' with "
                     "the feature '",
                     feature,
                     "', which is undefined or unsupported.\nDid you miss to "
                     "define it by setting variables \"CMAKE_",
                     this->LinkLanguage, "_LINK_LIBRARY_USING_", feature,
                     "\" and \"CMAKE_", this->LinkLanguage,
                     "_LINK_LIBRARY_USING_", feature, "_SUPPORTED\"?"),
            this->Target->GetBacktrace());
        }
      }
      continue;
    }
    if (cmHasPrefix(item.AsStr(), LL_END) && cmHasSuffix(item.AsStr(), '>')) {
      feature = LinkEntry::DEFAULT;
      continue;
    }

    if (cmHasPrefix(item.AsStr(), LG_BEGIN) &&
        cmHasSuffix(item.AsStr(), '>')) {
      groupIndex = this->AddLinkEntry(item);
      if (groupIndex.second) {
        LinkEntry& entry = this->EntryList[groupIndex.first];
        entry.Feature = ExtractGroupFeature(item.AsStr());
      }
      inGroup = true;
      if (depender_index >= 0) {
        this->EntryConstraintGraph[depender_index].emplace_back(
          groupIndex.first, false, false, cmListFileBacktrace());
      } else {
        // This is a direct dependency of the target being linked.
        this->OriginalEntries.push_back(groupIndex.first);
      }
      continue;
    }

    int dependee_index;

    if (cmHasPrefix(item.AsStr(), LG_END) && cmHasSuffix(item.AsStr(), '>')) {
      dependee_index = groupIndex.first;
      if (groupIndex.second) {
        this->GroupItems.emplace(groupIndex.first, groupItems);
      }
      inGroup = false;
      groupIndex = std::make_pair(-1, false);
      groupItems.clear();
      continue;
    }

    if (depender_index >= 0 && inGroup) {
      const auto& depender = this->EntryList[depender_index];
      const auto& groupFeature = this->EntryList[groupIndex.first].Feature;
      if (depender.Target != nullptr && depender.Target->IsImported() &&
          !IsGroupFeatureSupported(this->Makefile, this->LinkLanguage,
                                   groupFeature)) {
        this->CMakeInstance->IssueMessage(
          MessageType::AUTHOR_ERROR,
          cmStrCat("The 'IMPORTED' target '", depender.Target->GetName(),
                   "' uses the generator-expression '$<LINK_GROUP>' with "
                   "the feature '",
                   groupFeature,
                   "', which is undefined or unsupported.\nDid you miss to "
                   "define it by setting variables \"CMAKE_",
                   this->LinkLanguage, "_LINK_GROUP_USING_", groupFeature,
                   "\" and \"CMAKE_", this->LinkLanguage, "_LINK_GROUP_USING_",
                   groupFeature, "_SUPPORTED\"?"),
          this->Target->GetBacktrace());
      }
    }

    // Add a link entry for this item.
    auto ale = this->AddLinkEntry(item, groupIndex.first);
    dependee_index = ale.first;
    LinkEntry& entry = this->EntryList[dependee_index];
    auto const& itemFeature =
      this->GetCurrentFeature(entry.Item.Value, feature);
    if (inGroup && ale.second && entry.Target != nullptr &&
        (entry.Target->GetType() == cmStateEnums::TargetType::OBJECT_LIBRARY ||
         entry.Target->GetType() ==
           cmStateEnums::TargetType::INTERFACE_LIBRARY)) {
      const auto& groupFeature = this->EntryList[groupIndex.first].Feature;
      this->CMakeInstance->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(
          "The feature '", groupFeature,
          "', specified as part of a generator-expression "
          "'$",
          LG_BEGIN, groupFeature, ">', will not be applied to the ",
          (entry.Target->GetType() == cmStateEnums::TargetType::OBJECT_LIBRARY
             ? "OBJECT"
             : "INTERFACE"),
          " library '", entry.Item.Value, "'."),
        this->Target->GetBacktrace());
    }
    if (itemFeature != LinkEntry::DEFAULT) {
      if (ale.second) {
        // current item not yet defined
        if (entry.Target != nullptr &&
            (entry.Target->GetType() ==
               cmStateEnums::TargetType::OBJECT_LIBRARY ||
             entry.Target->GetType() ==
               cmStateEnums::TargetType::INTERFACE_LIBRARY)) {
          this->CMakeInstance->IssueMessage(
            MessageType::AUTHOR_WARNING,
            cmStrCat("The feature '", feature,
                     "', specified as part of a generator-expression "
                     "'$",
                     LL_BEGIN, feature, ">', will not be applied to the ",
                     (entry.Target->GetType() ==
                          cmStateEnums::TargetType::OBJECT_LIBRARY
                        ? "OBJECT"
                        : "INTERFACE"),
                     " library '", entry.Item.Value, "'."),
            this->Target->GetBacktrace());
        } else {
          entry.Feature = itemFeature;
        }
      }
    }

    bool supportedItem = entry.Target == nullptr ||
      (entry.Target->GetType() != cmStateEnums::TargetType::OBJECT_LIBRARY &&
       entry.Target->GetType() != cmStateEnums::TargetType::INTERFACE_LIBRARY);

    if (supportedItem) {
      if (inGroup) {
        const auto& currentFeature = this->EntryList[groupIndex.first].Feature;
        for (const auto& g : this->GroupItems) {
          const auto& groupFeature = this->EntryList[g.first].Feature;
          if (groupFeature == currentFeature) {
            continue;
          }
          if (std::find(g.second.cbegin(), g.second.cend(), dependee_index) !=
              g.second.cend()) {
            this->CMakeInstance->IssueMessage(
              MessageType::FATAL_ERROR,
              cmStrCat("Impossible to link target '", this->Target->GetName(),
                       "' because the link item '", entry.Item.Value,
                       "', specified with the group feature '", currentFeature,
                       '\'', ", has already occurred with the feature '",
                       groupFeature, '\'', ", which is not allowed."),
              this->Target->GetBacktrace());
            continue;
          }
        }
      }
      if (entry.Feature != itemFeature) {
        // incompatibles features occurred
        this->CMakeInstance->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("Impossible to link target '", this->Target->GetName(),
                   "' because the link item '", entry.Item.Value,
                   "', specified ",
                   (itemFeature == LinkEntry::DEFAULT
                      ? "without any feature or 'DEFAULT' feature"
                      : cmStrCat("with the feature '", itemFeature, '\'')),
                   ", has already occurred ",
                   (entry.Feature == LinkEntry::DEFAULT
                      ? "without any feature or 'DEFAULT' feature"
                      : cmStrCat("with the feature '", entry.Feature, '\'')),
                   ", which is not allowed."),
          this->Target->GetBacktrace());
      }
    }

    if (inGroup) {
      // store item index for dependencies handling
      groupItems.push_back(dependee_index);
    } else {
      std::vector<int> indexes;
      bool entryHandled = false;
      // search any occurrence of the library in already defined groups
      for (const auto& group : this->GroupItems) {
        for (auto index : group.second) {
          if (entry.Item.Value == this->EntryList[index].Item.Value) {
            indexes.push_back(group.first);
            entryHandled = true;
            break;
          }
        }
      }
      if (!entryHandled) {
        indexes.push_back(dependee_index);
      }

      for (auto index : indexes) {
        // The dependee must come after the depender.
        if (depender_index >= 0) {
          this->EntryConstraintGraph[depender_index].emplace_back(
            index, false, false, cmListFileBacktrace());
        } else {
          // This is a direct dependency of the target being linked.
          this->OriginalEntries.push_back(index);
        }

        // Update the inferred dependencies for earlier items.
        for (auto& dependSet : dependSets) {
          // Add this item to the inferred dependencies of other items.
          // Target items are never inferred dependees because unknown
          // items are outside libraries that should not be depending on
          // targets.
          if (!this->EntryList[index].Target &&
              this->EntryList[index].Kind != LinkEntry::Flag &&
              this->EntryList[index].Kind != LinkEntry::Group &&
              dependee_index != dependSet.first) {
            dependSet.second.insert(index);
          }
        }

        // If this item needs to have dependencies inferred, do so.
        if (this->InferredDependSets[index].Initialized) {
          // Make sure an entry exists to hold the set for the item.
          dependSets[index];
        }
      }
    }
  }

  // Store the inferred dependency sets discovered for this list.
  for (auto const& dependSet : dependSets) {
    this->InferredDependSets[dependSet.first].push_back(dependSet.second);
  }
}